

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wskey.cpp
# Opt level: O1

void __thiscall Sha1_Test1_Test::TestBody(Sha1_Test1_Test *this)

{
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  digest_00;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  char *pcVar1;
  AssertionResult AVar2;
  AssertionResult gtest_ar;
  char test [3];
  result_type digest;
  sha1 sha;
  AssertHelper local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  string local_c8;
  element_type local_a0 [4];
  undefined1 local_9c [28];
  undefined8 uStack_80;
  uchar local_78 [8];
  uchar local_70 [76];
  undefined2 local_24;
  
  local_c8._M_string_length = (size_type)local_a0;
  local_a0[2] = 99;
  local_a0[0] = 'a';
  local_a0[1] = 'b';
  local_78[0] = 0xf0;
  local_78[1] = 0xe1;
  local_78[2] = 0xd2;
  local_78[3] = 0xc3;
  local_9c._20_8_ = 0xefcdab8967452301;
  uStack_80 = 0x1032547698badcfe;
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_70[4] = '\0';
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  local_70[8] = '\0';
  local_70[9] = '\0';
  local_70[10] = '\0';
  local_70[0xb] = '\0';
  local_24 = 0;
  local_c8._M_dataplus._M_p = (pointer)0x3;
  pstore::http::sha1::input((sha1 *)(local_9c + 0x14),(span<const_unsigned_char,__1L> *)&local_c8);
  pstore::http::sha1::result((result_type *)local_9c,(sha1 *)(local_9c + 0x14));
  local_c8._M_dataplus._M_p = (pointer)0x6a810647363e99a9;
  local_c8._M_string_length = 0x6cc2507871253eba;
  local_c8.field_2._M_allocated_capacity._0_4_ = 0x9dd8d09c;
  AVar2 = testing::internal::
          PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,20ul>>>>
          ::operator()(local_d8,(char *)&local_c8,(array<unsigned_char,_20UL> *)"digest");
  digest_00._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar2.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x21,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    digest_00 = extraout_RDX.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
      digest_00._M_head_impl = extraout_RDX_00;
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
    digest_00._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_01.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
  pstore::http::sha1::digest_to_base64_abi_cxx11_
            (&local_c8,(sha1 *)local_9c,(result_type *)digest_00._M_head_impl);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[29]>
            (local_d8,"pstore::http::sha1::digest_to_base64 (digest)",
             "\"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=\"",&local_c8,
             (char (*) [29])"qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT44(local_c8.field_2._M_allocated_capacity._4_4_,
                             local_c8.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_wskey.cpp"
               ,0x23,pcVar1);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    if ((long *)local_c8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_c8._M_dataplus._M_p + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  return;
}

Assistant:

TEST (Sha1, Test1) {
    char const test[] = {'a', 'b', 'c'};
    PSTORE_STATIC_ASSERT (sizeof (char) == sizeof (std::uint8_t));

    pstore::http::sha1 sha;
    sha.input (pstore::gsl::make_span (reinterpret_cast<std::uint8_t const *> (test),
                                       pstore::array_elements (test)));
    pstore::http::sha1::result_type const digest = sha.result ();
    EXPECT_THAT (digest, testing::ContainerEq (pstore::http::sha1::result_type{
                             {0xA9, 0x99, 0x3E, 0x36, 0x47, 0x06, 0x81, 0x6A, 0xBA, 0x3E,
                              0x25, 0x71, 0x78, 0x50, 0xC2, 0x6C, 0x9C, 0xD0, 0xD8, 0x9D}}));

    EXPECT_EQ (pstore::http::sha1::digest_to_base64 (digest), "qZk+NkcGgWq6PiVxeFDCbJzQ2J0=");
}